

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::F_formatter::format(F_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  unsigned_long n;
  scoped_pad p;
  
  n = (msg->time).__d.__r % 1000000000;
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    scoped_pad::scoped_pad(&p,9,&(this->super_flag_formatter).padinfo_,dest);
    fmt_helper::pad9<unsigned_long,500ul>(n,dest);
    scoped_pad::~scoped_pad(&p);
    return;
  }
  fmt_helper::pad9<unsigned_long,500ul>(n,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 9;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
        else
        {
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
    }